

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyhedron_algorithms.cpp
# Opt level: O0

void __thiscall sch::Polyhedron_algorithms::updateFastArrays(Polyhedron_algorithms *this)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  S_PolyhedronVertex **ppSVar4;
  reference ppSVar5;
  uint local_14;
  uint i;
  Polyhedron_algorithms *this_local;
  
  if ((this->fastVertexes_ != (S_PolyhedronVertex **)0x0) &&
     (this->fastVertexes_ != (S_PolyhedronVertex **)0x0)) {
    operator_delete__(this->fastVertexes_);
  }
  sVar2 = std::vector<sch::S_PolyhedronVertex_*,_std::allocator<sch::S_PolyhedronVertex_*>_>::size
                    (&this->vertexes_);
  this->numberOfVertices_ = (uint)sVar2;
  if (this->numberOfVertices_ == 0) {
    this->lastVertexes_ = (S_PolyhedronVertex **)0x0;
    this->fastVertexes_ = (S_PolyhedronVertex **)0x0;
  }
  else {
    auVar1 = ZEXT416(this->numberOfVertices_) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppSVar4 = (S_PolyhedronVertex **)operator_new__(uVar3);
    this->fastVertexes_ = ppSVar4;
    for (local_14 = 0; local_14 < this->numberOfVertices_; local_14 = local_14 + 1) {
      ppSVar5 = std::vector<sch::S_PolyhedronVertex_*,_std::allocator<sch::S_PolyhedronVertex_*>_>::
                operator[](&this->vertexes_,(ulong)local_14);
      this->fastVertexes_[local_14] = *ppSVar5;
    }
    this->lastVertexes_ = this->fastVertexes_ + this->numberOfVertices_;
  }
  return;
}

Assistant:

void Polyhedron_algorithms::updateFastArrays()
{
  if(fastVertexes_ != NULL)
  {
    delete[] fastVertexes_;
  }
  numberOfVertices_ = unsigned(vertexes_.size());
  if(numberOfVertices_ > 0)
  {
    fastVertexes_ = new S_PolyhedronVertex *[numberOfVertices_];
    for(unsigned int i = 0; i < numberOfVertices_; ++i)
    {
      fastVertexes_[i] = vertexes_[i];
    }

    lastVertexes_ = &(fastVertexes_[numberOfVertices_]);
  }
  else
  {
    fastVertexes_ = lastVertexes_ = NULL;
  }
}